

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O0

int archive_read_format_ar_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  long *plVar1;
  void *pvVar2;
  int64_t iVar3;
  int64_t skipped;
  ar *ar;
  ssize_t bytes_read;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  plVar1 = (long *)a->format->data;
  bytes_read = (ssize_t)offset;
  offset_local = (int64_t *)size;
  size_local = (size_t *)buff;
  buff_local = (void **)a;
  if (plVar1[1] != 0) {
    __archive_read_consume(a,plVar1[1]);
    plVar1[1] = 0;
  }
  if (*plVar1 < 1) {
    iVar3 = __archive_read_consume((archive_read *)buff_local,plVar1[3]);
    if (-1 < iVar3) {
      plVar1[3] = plVar1[3] - iVar3;
    }
    if (plVar1[3] == 0) {
      *size_local = 0;
      *offset_local = 0;
      *(long *)bytes_read = plVar1[2];
      a_local._4_4_ = 1;
    }
    else {
      if (-1 < iVar3) {
        archive_set_error((archive *)buff_local,-1,"Truncated ar archive- failed consuming padding")
        ;
      }
      a_local._4_4_ = -0x1e;
    }
  }
  else {
    pvVar2 = __archive_read_ahead((archive_read *)buff_local,1,(ssize_t *)&ar);
    *size_local = (size_t)pvVar2;
    if (ar == (ar *)0x0) {
      archive_set_error((archive *)buff_local,-1,"Truncated ar archive");
      a_local._4_4_ = -0x1e;
    }
    else if ((long)ar < 0) {
      a_local._4_4_ = -0x1e;
    }
    else {
      if (*plVar1 < (long)ar) {
        ar = (ar *)*plVar1;
      }
      *offset_local = (int64_t)ar;
      plVar1[1] = (long)ar;
      *(long *)bytes_read = plVar1[2];
      plVar1[2] = (long)&ar->entry_bytes_remaining + plVar1[2];
      *plVar1 = *plVar1 - (long)ar;
      a_local._4_4_ = 0;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_ar_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	ssize_t bytes_read;
	struct ar *ar;

	ar = (struct ar *)(a->format->data);

	if (ar->entry_bytes_unconsumed) {
		__archive_read_consume(a, ar->entry_bytes_unconsumed);
		ar->entry_bytes_unconsumed = 0;
	}

	if (ar->entry_bytes_remaining > 0) {
		*buff = __archive_read_ahead(a, 1, &bytes_read);
		if (bytes_read == 0) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Truncated ar archive");
			return (ARCHIVE_FATAL);
		}
		if (bytes_read < 0)
			return (ARCHIVE_FATAL);
		if (bytes_read > ar->entry_bytes_remaining)
			bytes_read = (ssize_t)ar->entry_bytes_remaining;
		*size = bytes_read;
		ar->entry_bytes_unconsumed = bytes_read;
		*offset = ar->entry_offset;
		ar->entry_offset += bytes_read;
		ar->entry_bytes_remaining -= bytes_read;
		return (ARCHIVE_OK);
	} else {
		int64_t skipped = __archive_read_consume(a, ar->entry_padding);
		if (skipped >= 0) {
			ar->entry_padding -= skipped;
		}
		if (ar->entry_padding) {
			if (skipped >= 0) {
				archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
					"Truncated ar archive- failed consuming padding");
			}
			return (ARCHIVE_FATAL);
		}
		*buff = NULL;
		*size = 0;
		*offset = ar->entry_offset;
		return (ARCHIVE_EOF);
	}
}